

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_flags_decoder.c
# Opt level: O1

lzma_ret lzma_filter_flags_decode
                   (lzma_filter *filter,lzma_allocator *allocator,uint8_t *in,size_t *in_pos,
                   size_t in_size)

{
  lzma_ret lVar1;
  ulong in_RAX;
  lzma_vli props_size;
  ulong local_38;
  
  filter->options = (void *)0x0;
  local_38 = in_RAX;
  lVar1 = lzma_vli_decode(&filter->id,(size_t *)0x0,in,in_pos,in_size);
  if (((lVar1 == LZMA_OK) && (lVar1 = LZMA_DATA_ERROR, filter->id >> 0x3e == 0)) &&
     (lVar1 = lzma_vli_decode(&local_38,(size_t *)0x0,in,in_pos,in_size), lVar1 == LZMA_OK)) {
    lVar1 = LZMA_DATA_ERROR;
    if (local_38 <= in_size - *in_pos) {
      lVar1 = lzma_properties_decode(filter,allocator,in + *in_pos,local_38);
      *in_pos = *in_pos + local_38;
    }
  }
  return lVar1;
}

Assistant:

extern LZMA_API(lzma_ret)
lzma_filter_flags_decode(
		lzma_filter *filter, const lzma_allocator *allocator,
		const uint8_t *in, size_t *in_pos, size_t in_size)
{
	// Set the pointer to NULL so the caller can always safely free it.
	filter->options = NULL;

	// Filter ID
	return_if_error(lzma_vli_decode(&filter->id, NULL,
			in, in_pos, in_size));

	if (filter->id >= LZMA_FILTER_RESERVED_START)
		return LZMA_DATA_ERROR;

	// Size of Properties
	lzma_vli props_size;
	return_if_error(lzma_vli_decode(&props_size, NULL,
			in, in_pos, in_size));

	// Filter Properties
	if (in_size - *in_pos < props_size)
		return LZMA_DATA_ERROR;

	const lzma_ret ret = lzma_properties_decode(
			filter, allocator, in + *in_pos, props_size);

	*in_pos += props_size;

	return ret;
}